

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-spa.c
# Opt level: O1

int lws_spa_destroy(lws_spa *spa)

{
  lwsac **head;
  
  _lws_log(8,"%s: destroy spa %p\n","lws_spa_destroy",spa);
  if (spa->s != (lws_urldecode_stateful *)0x0) {
    lws_urldecode_s_destroy(spa,spa->s);
  }
  head = (spa->i).ac;
  if (head == (lwsac **)0x0) {
    lws_realloc(spa->param_length,0,"lws_free");
    lws_realloc(spa->params,0,"lws_free");
    lws_realloc(spa->storage,0,"lws_free");
    lws_realloc(spa,0,"lws_free");
  }
  else {
    lwsac_free(head);
  }
  return 0;
}

Assistant:

int
lws_spa_destroy(struct lws_spa *spa)
{
	int n = 0;

	lwsl_info("%s: destroy spa %p\n", __func__, spa);

	if (spa->s)
		lws_urldecode_s_destroy(spa, spa->s);

	if (spa->i.ac)
		lwsac_free(spa->i.ac);
	else {
		lws_free(spa->param_length);
		lws_free(spa->params);
		lws_free(spa->storage);
		lws_free(spa);
	}

	return n;
}